

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

NodeData * __thiscall c4::yml::Parser::_append_val(Parser *this,csubstr val,flag_t quoted)

{
  ulong uVar1;
  Tree *pTVar2;
  size_t node;
  char *pcVar3;
  code *pcVar4;
  Location LVar5;
  undefined1 auVar6 [24];
  Location LVar7;
  Location LVar8;
  bool bVar9;
  NodeData *pNVar10;
  size_t ichild;
  csubstr tag;
  csubstr cVar11;
  char msg [32];
  char local_f8 [64];
  char *local_b8;
  size_t local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  local_b0 = val.len;
  local_b8 = val.str;
  if ((this->m_state->flags & 0x200) != 0) {
    builtin_strncpy(local_f8 + 0x10," has_all(SSCL))",0x10);
    builtin_strncpy(local_f8,"check failed: (!",0x10);
    if ((s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar4 = (code *)swi(3);
        pNVar10 = (NodeData *)(*pcVar4)();
        return pNVar10;
      }
    }
    local_58 = 0;
    uStack_50 = 0x78f5;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    auVar6 = ZEXT1224(ZEXT412(0x78f5) << 0x40);
    LVar5.name.str._0_4_ = 0x250b5d;
    LVar5.super_LineCol.offset = auVar6._0_8_;
    LVar5.super_LineCol.line = auVar6._8_8_;
    LVar5.super_LineCol.col = auVar6._16_8_;
    LVar5.name.str._4_4_ = 0;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_f8,0x20,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar1 = this->m_state->node_id;
  if (uVar1 != 0xffffffffffffffff) {
    pTVar2 = this->m_tree;
    if (pTVar2->m_cap <= uVar1) {
      if ((s_error_flags & 1) != 0) {
        bVar9 = is_debugger_attached();
        if (bVar9) {
          pcVar4 = (code *)swi(3);
          pNVar10 = (NodeData *)(*pcVar4)();
          return pNVar10;
        }
      }
      local_f8[0] = '\0';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[8] = 't';
      local_f8[9] = 'K';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      local_f8[0x18] = ']';
      local_f8[0x19] = '\v';
      local_f8[0x1a] = '%';
      local_f8[0x1b] = '\0';
      local_f8[0x1c] = '\0';
      local_f8[0x1d] = '\0';
      local_f8[0x1e] = '\0';
      local_f8[0x1f] = '\0';
      local_f8[0x20] = 0x65;
      local_f8[0x21] = '\0';
      local_f8[0x22] = '\0';
      local_f8[0x23] = '\0';
      local_f8[0x24] = '\0';
      local_f8[0x25] = '\0';
      local_f8[0x26] = '\0';
      local_f8[0x27] = '\0';
      (*(code *)PTR_error_impl_002a27a8)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    if (pTVar2->m_buf != (NodeData *)0x0) goto LAB_00227c51;
  }
  builtin_strncpy(local_f8 + 0x10,"ode(m_state) != nullptr)",0x19);
  builtin_strncpy(local_f8,"check failed: (n",0x10);
  if ((s_error_flags & 1) != 0) {
    bVar9 = is_debugger_attached();
    if (bVar9) {
      pcVar4 = (code *)swi(3);
      pNVar10 = (NodeData *)(*pcVar4)();
      return pNVar10;
    }
  }
  local_80 = 0;
  uStack_78 = 0x78f6;
  local_70 = 0;
  pcStack_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  local_60 = 0x65;
  auVar6 = ZEXT1224(ZEXT412(0x78f6) << 0x40);
  LVar7.name.str._0_4_ = 0x250b5d;
  LVar7.super_LineCol.offset = auVar6._0_8_;
  LVar7.super_LineCol.line = auVar6._8_8_;
  LVar7.super_LineCol.col = auVar6._16_8_;
  LVar7.name.str._4_4_ = 0;
  LVar7.name.len = 0x65;
  (*(this->m_stack).m_callbacks.m_error)
            (local_f8,0x29,LVar7,(this->m_stack).m_callbacks.m_user_data);
LAB_00227c51:
  pTVar2 = this->m_tree;
  uVar1 = this->m_state->node_id;
  if ((uVar1 == 0xffffffffffffffff) || (pTVar2->m_cap <= uVar1)) {
    if ((s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar4 = (code *)swi(3);
        pNVar10 = (NodeData *)(*pcVar4)();
        return pNVar10;
      }
    }
    local_f8[0] = '\0';
    local_f8[1] = '\0';
    local_f8[2] = '\0';
    local_f8[3] = '\0';
    local_f8[4] = '\0';
    local_f8[5] = '\0';
    local_f8[6] = '\0';
    local_f8[7] = '\0';
    local_f8[8] = -0x7a;
    local_f8[9] = 'K';
    local_f8[10] = '\0';
    local_f8[0xb] = '\0';
    local_f8[0xc] = '\0';
    local_f8[0xd] = '\0';
    local_f8[0xe] = '\0';
    local_f8[0xf] = '\0';
    local_f8[0x10] = '\0';
    local_f8[0x11] = '\0';
    local_f8[0x12] = '\0';
    local_f8[0x13] = '\0';
    local_f8[0x14] = '\0';
    local_f8[0x15] = '\0';
    local_f8[0x16] = '\0';
    local_f8[0x17] = '\0';
    local_f8[0x18] = ']';
    local_f8[0x19] = '\v';
    local_f8[0x1a] = '%';
    local_f8[0x1b] = '\0';
    local_f8[0x1c] = '\0';
    local_f8[0x1d] = '\0';
    local_f8[0x1e] = '\0';
    local_f8[0x1f] = '\0';
    local_f8[0x20] = 0x65;
    local_f8[0x21] = '\0';
    local_f8[0x22] = '\0';
    local_f8[0x23] = '\0';
    local_f8[0x24] = '\0';
    local_f8[0x25] = '\0';
    local_f8[0x26] = '\0';
    local_f8[0x27] = '\0';
    (*(code *)PTR_error_impl_002a27a8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((pTVar2->m_buf[uVar1].m_type.type & SEQ) == NOTYPE) {
    builtin_strncpy(local_f8 + 0x10,"_tree->is_seq(m_state->node_id))",0x21);
    builtin_strncpy(local_f8,"check failed: (m",0x10);
    if ((s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar4 = (code *)swi(3);
        pNVar10 = (NodeData *)(*pcVar4)();
        return pNVar10;
      }
    }
    local_a8 = 0;
    uStack_a0 = 0x78f7;
    local_98 = 0;
    pcStack_90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_88 = 0x65;
    auVar6 = ZEXT1224(ZEXT412(0x78f7) << 0x40);
    LVar8.name.str._0_4_ = 0x250b5d;
    LVar8.super_LineCol.offset = auVar6._0_8_;
    LVar8.super_LineCol.line = auVar6._8_8_;
    LVar8.super_LineCol.col = auVar6._16_8_;
    LVar8.name.str._4_4_ = 0;
    LVar8.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_f8,0x31,LVar8,(this->m_stack).m_callbacks.m_user_data);
  }
  pTVar2 = this->m_tree;
  node = this->m_state->node_id;
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar4 = (code *)swi(3);
        pNVar10 = (NodeData *)(*pcVar4)();
        return pNVar10;
      }
    }
    local_f8[0] = '\0';
    local_f8[1] = '\0';
    local_f8[2] = '\0';
    local_f8[3] = '\0';
    local_f8[4] = '\0';
    local_f8[5] = '\0';
    local_f8[6] = '\0';
    local_f8[7] = '\0';
    local_f8[8] = -0x7d;
    local_f8[9] = 'K';
    local_f8[10] = '\0';
    local_f8[0xb] = '\0';
    local_f8[0xc] = '\0';
    local_f8[0xd] = '\0';
    local_f8[0xe] = '\0';
    local_f8[0xf] = '\0';
    local_f8[0x10] = '\0';
    local_f8[0x11] = '\0';
    local_f8[0x12] = '\0';
    local_f8[0x13] = '\0';
    local_f8[0x14] = '\0';
    local_f8[0x15] = '\0';
    local_f8[0x16] = '\0';
    local_f8[0x17] = '\0';
    local_f8[0x18] = ']';
    local_f8[0x19] = '\v';
    local_f8[0x1a] = '%';
    local_f8[0x1b] = '\0';
    local_f8[0x1c] = '\0';
    local_f8[0x1d] = '\0';
    local_f8[0x1e] = '\0';
    local_f8[0x1f] = '\0';
    local_f8[0x20] = 0x65;
    local_f8[0x21] = '\0';
    local_f8[0x22] = '\0';
    local_f8[0x23] = '\0';
    local_f8[0x24] = '\0';
    local_f8[0x25] = '\0';
    local_f8[0x26] = '\0';
    local_f8[0x27] = '\0';
    (*(code *)PTR_error_impl_002a27a8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  uVar1 = pTVar2->m_buf[node].m_last_child;
  if (node == 0xffffffffffffffff) {
    if ((s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar4 = (code *)swi(3);
        pNVar10 = (NodeData *)(*pcVar4)();
        return pNVar10;
      }
    }
    local_f8[0] = '\0';
    local_f8[1] = '\0';
    local_f8[2] = '\0';
    local_f8[3] = '\0';
    local_f8[4] = '\0';
    local_f8[5] = '\0';
    local_f8[6] = '\0';
    local_f8[7] = '\0';
    local_f8[8] = -0x4f;
    local_f8[9] = 'L';
    local_f8[10] = '\0';
    local_f8[0xb] = '\0';
    local_f8[0xc] = '\0';
    local_f8[0xd] = '\0';
    local_f8[0xe] = '\0';
    local_f8[0xf] = '\0';
    local_f8[0x10] = '\0';
    local_f8[0x11] = '\0';
    local_f8[0x12] = '\0';
    local_f8[0x13] = '\0';
    local_f8[0x14] = '\0';
    local_f8[0x15] = '\0';
    local_f8[0x16] = '\0';
    local_f8[0x17] = '\0';
    local_f8[0x18] = ']';
    local_f8[0x19] = '\v';
    local_f8[0x1a] = '%';
    local_f8[0x1b] = '\0';
    local_f8[0x1c] = '\0';
    local_f8[0x1d] = '\0';
    local_f8[0x1e] = '\0';
    local_f8[0x1f] = '\0';
    local_f8[0x20] = 0x65;
    local_f8[0x21] = '\0';
    local_f8[0x22] = '\0';
    local_f8[0x23] = '\0';
    local_f8[0x24] = '\0';
    local_f8[0x25] = '\0';
    local_f8[0x26] = '\0';
    local_f8[0x27] = '\0';
    (*(code *)PTR_error_impl_002a27a8)
              ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
  }
  if ((node == 0xffffffffffffffff) || (pTVar2->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar4 = (code *)swi(3);
        pNVar10 = (NodeData *)(*pcVar4)();
        return pNVar10;
      }
    }
    local_f8[0] = '\0';
    local_f8[1] = '\0';
    local_f8[2] = '\0';
    local_f8[3] = '\0';
    local_f8[4] = '\0';
    local_f8[5] = '\0';
    local_f8[6] = '\0';
    local_f8[7] = '\0';
    local_f8[8] = -0x7a;
    local_f8[9] = 'K';
    local_f8[10] = '\0';
    local_f8[0xb] = '\0';
    local_f8[0xc] = '\0';
    local_f8[0xd] = '\0';
    local_f8[0xe] = '\0';
    local_f8[0xf] = '\0';
    local_f8[0x10] = '\0';
    local_f8[0x11] = '\0';
    local_f8[0x12] = '\0';
    local_f8[0x13] = '\0';
    local_f8[0x14] = '\0';
    local_f8[0x15] = '\0';
    local_f8[0x16] = '\0';
    local_f8[0x17] = '\0';
    local_f8[0x18] = ']';
    local_f8[0x19] = '\v';
    local_f8[0x1a] = '%';
    local_f8[0x1b] = '\0';
    local_f8[0x1c] = '\0';
    local_f8[0x1d] = '\0';
    local_f8[0x1e] = '\0';
    local_f8[0x1f] = '\0';
    local_f8[0x20] = 0x65;
    local_f8[0x21] = '\0';
    local_f8[0x22] = '\0';
    local_f8[0x23] = '\0';
    local_f8[0x24] = '\0';
    local_f8[0x25] = '\0';
    local_f8[0x26] = '\0';
    local_f8[0x27] = '\0';
    (*(code *)PTR_error_impl_002a27a8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((pTVar2->m_buf[node].m_type.type & (STREAM|MAP)) == NOTYPE) {
    bVar9 = Tree::is_root(pTVar2,node);
    if (!bVar9) {
      if ((s_error_flags & 1) != 0) {
        bVar9 = is_debugger_attached();
        if (bVar9) {
          pcVar4 = (code *)swi(3);
          pNVar10 = (NodeData *)(*pcVar4)();
          return pNVar10;
        }
      }
      local_f8[0] = '\0';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[8] = -0x4e;
      local_f8[9] = 'L';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      local_f8[0x18] = ']';
      local_f8[0x19] = '\v';
      local_f8[0x1a] = '%';
      local_f8[0x1b] = '\0';
      local_f8[0x1c] = '\0';
      local_f8[0x1d] = '\0';
      local_f8[0x1e] = '\0';
      local_f8[0x1f] = '\0';
      local_f8[0x20] = 0x65;
      local_f8[0x21] = '\0';
      local_f8[0x22] = '\0';
      local_f8[0x23] = '\0';
      local_f8[0x24] = '\0';
      local_f8[0x25] = '\0';
      local_f8[0x26] = '\0';
      local_f8[0x27] = '\0';
      (*(code *)PTR_error_impl_002a27a8)
                ("check failed: is_container(parent) || is_root(parent)",0x35,
                 (anonymous_namespace)::s_default_callbacks);
    }
  }
  if (uVar1 != 0xffffffffffffffff) {
    if (pTVar2->m_cap <= uVar1) {
      if ((s_error_flags & 1) != 0) {
        bVar9 = is_debugger_attached();
        if (bVar9) {
          pcVar4 = (code *)swi(3);
          pNVar10 = (NodeData *)(*pcVar4)();
          return pNVar10;
        }
      }
      local_f8[0] = '\0';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[8] = -0x7d;
      local_f8[9] = 'K';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      local_f8[0x18] = ']';
      local_f8[0x19] = '\v';
      local_f8[0x1a] = '%';
      local_f8[0x1b] = '\0';
      local_f8[0x1c] = '\0';
      local_f8[0x1d] = '\0';
      local_f8[0x1e] = '\0';
      local_f8[0x1f] = '\0';
      local_f8[0x20] = 0x65;
      local_f8[0x21] = '\0';
      local_f8[0x22] = '\0';
      local_f8[0x23] = '\0';
      local_f8[0x24] = '\0';
      local_f8[0x25] = '\0';
      local_f8[0x26] = '\0';
      local_f8[0x27] = '\0';
      (*(code *)PTR_error_impl_002a27a8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if (pTVar2->m_buf[uVar1].m_parent != node) {
      if ((s_error_flags & 1) != 0) {
        bVar9 = is_debugger_attached();
        if (bVar9) {
          pcVar4 = (code *)swi(3);
          pNVar10 = (NodeData *)(*pcVar4)();
          return pNVar10;
        }
      }
      local_f8[0] = '\0';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[8] = -0x4d;
      local_f8[9] = 'L';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      local_f8[0x18] = ']';
      local_f8[0x19] = '\v';
      local_f8[0x1a] = '%';
      local_f8[0x1b] = '\0';
      local_f8[0x1c] = '\0';
      local_f8[0x1d] = '\0';
      local_f8[0x1e] = '\0';
      local_f8[0x1f] = '\0';
      local_f8[0x20] = 0x65;
      local_f8[0x21] = '\0';
      local_f8[0x22] = '\0';
      local_f8[0x23] = '\0';
      local_f8[0x24] = '\0';
      local_f8[0x25] = '\0';
      local_f8[0x26] = '\0';
      local_f8[0x27] = '\0';
      (*(code *)PTR_error_impl_002a27a8)
                ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                 (anonymous_namespace)::s_default_callbacks);
    }
  }
  ichild = Tree::_claim(pTVar2);
  Tree::_set_hierarchy(pTVar2,ichild,node,uVar1);
  cVar11.len = local_b0;
  cVar11.str = local_b8;
  Tree::to_val(this->m_tree,ichild,cVar11,(ulong)(quoted != 0) << 0xc);
  pcVar3 = (this->m_val_tag).str;
  if (pcVar3 != (char *)0x0 && (this->m_val_tag).len != 0) {
    pTVar2 = this->m_tree;
    tag.len = (this->m_val_tag).len;
    tag.str = pcVar3;
    cVar11 = normalize_tag(tag);
    Tree::set_val_tag(pTVar2,ichild,cVar11);
    (this->m_val_tag).str = (char *)0x0;
    (this->m_val_tag).len = 0;
  }
  _write_val_anchor(this,ichild);
  if (ichild == 0xffffffffffffffff) {
    pNVar10 = (NodeData *)0x0;
  }
  else {
    pTVar2 = this->m_tree;
    if (pTVar2->m_cap <= ichild) {
      if ((s_error_flags & 1) != 0) {
        bVar9 = is_debugger_attached();
        if (bVar9) {
          pcVar4 = (code *)swi(3);
          pNVar10 = (NodeData *)(*pcVar4)();
          return pNVar10;
        }
      }
      local_f8[0] = '\0';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[8] = 't';
      local_f8[9] = 'K';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      local_f8[0x18] = ']';
      local_f8[0x19] = '\v';
      local_f8[0x1a] = '%';
      local_f8[0x1b] = '\0';
      local_f8[0x1c] = '\0';
      local_f8[0x1d] = '\0';
      local_f8[0x1e] = '\0';
      local_f8[0x1f] = '\0';
      local_f8[0x20] = 0x65;
      local_f8[0x21] = '\0';
      local_f8[0x22] = '\0';
      local_f8[0x23] = '\0';
      local_f8[0x24] = '\0';
      local_f8[0x25] = '\0';
      local_f8[0x26] = '\0';
      local_f8[0x27] = '\0';
      (*(code *)PTR_error_impl_002a27a8)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    pNVar10 = pTVar2->m_buf + ichild;
  }
  return pNVar10;
}

Assistant:

NodeData* Parser::_append_val(csubstr val, flag_t quoted)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks,  ! has_all(SSCL));
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_state) != nullptr);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_seq(m_state->node_id));
    type_bits additional_flags = quoted ? VALQUO : NOTYPE;
    _c4dbgpf("append val: '{}' to parent id={} (level={}){}", val, m_state->node_id, m_state->level, quoted ? " VALQUO!" : "");
    size_t nid = m_tree->append_child(m_state->node_id);
    m_tree->to_val(nid, val, additional_flags);

    _c4dbgpf("append val: id={} val='{}'", nid, m_tree->get(nid)->m_val.scalar);
    if( ! m_val_tag.empty())
    {
        _c4dbgpf("append val[{}]: set val tag='{}' -> '{}'", nid, m_val_tag, normalize_tag(m_val_tag));
        m_tree->set_val_tag(nid, normalize_tag(m_val_tag));
        m_val_tag.clear();
    }
    _write_val_anchor(nid);
    return m_tree->get(nid);
}